

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

Generators<unary_op_tuple<trng::portable_impl::uint128,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
Catch::Generators::
makeGenerators<unary_op_tuple<trng::portable_impl::uint128,std::__cxx11::string>,unary_op_tuple<trng::portable_impl::uint128,std::__cxx11::string>,unary_op_tuple<trng::portable_impl::uint128,std::__cxx11::string>>
          (Generators<unary_op_tuple<trng::portable_impl::uint128,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,Generators *this,
          unary_op_tuple<trng::portable_impl::uint128,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *val,unary_op_tuple<trng::portable_impl::uint128,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *moreGenerators,
          unary_op_tuple<trng::portable_impl::uint128,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *moreGenerators_1)

{
  _Head_base<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
  local_30;
  IGenerator<unary_op_tuple<trng::portable_impl::uint128,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_28;
  
  pf::
  make_unique<Catch::Generators::SingleValueGenerator<unary_op_tuple<trng::portable_impl::uint128,std::__cxx11::string>>,unary_op_tuple<trng::portable_impl::uint128,std::__cxx11::string>>
            ((pf *)&local_28,
             (unary_op_tuple<trng::portable_impl::uint128,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this);
  local_30._M_head_impl = local_28;
  Generators<unary_op_tuple<trng::portable_impl::uint128,std::__cxx11::string>>::
  Generators<Catch::Generators::GeneratorWrapper<unary_op_tuple<trng::portable_impl::uint128,std::__cxx11::string>>,unary_op_tuple<trng::portable_impl::uint128,std::__cxx11::string>,unary_op_tuple<trng::portable_impl::uint128,std::__cxx11::string>>
            ((Generators<unary_op_tuple<trng::portable_impl::uint128,std::__cxx11::string>> *)
             __return_storage_ptr__,
             (GeneratorWrapper<unary_op_tuple<trng::portable_impl::uint128,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_30,val,moreGenerators);
  if (local_30._M_head_impl !=
      (IGenerator<unary_op_tuple<trng::portable_impl::uint128,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
    (*((local_30._M_head_impl)->super_GeneratorUntypedBase)._vptr_GeneratorUntypedBase[1])();
  }
  return __return_storage_ptr__;
}

Assistant:

auto makeGenerators( T&& val, Gs &&... moreGenerators ) -> Generators<T> {
        return makeGenerators( value( std::forward<T>( val ) ), std::forward<Gs>( moreGenerators )... );
    }